

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O3

VarOrConst __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
::
AssignResult2Args<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
           *this,CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>
                 *fc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  VarOrConst VVar3;
  BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>
  local_80;
  
  paVar2 = &local_80.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_80.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p;
  paVar1 = &(fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p ==
      paVar1) {
    local_80.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
    _M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._8_8_ =
         *(undefined8 *)
          ((long)&(fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2 + 8);
    local_80.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
         (pointer)paVar2;
  }
  else {
    local_80.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
    _M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_80.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length =
       (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length;
  (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
  (fc->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length = 0;
  (fc->super_FunctionalConstraint).super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_80.constr_.super_FunctionalConstraint.result_var_ =
       (fc->super_FunctionalConstraint).result_var_;
  local_80.constr_.super_FunctionalConstraint.ctx.value_ =
       (fc->super_FunctionalConstraint).ctx.value_;
  local_80.constr_.
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
  .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (fc->
       super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
       ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_80.constr_.
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
  .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (fc->
       super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
       ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_80.constr_.
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
  .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (fc->
       super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
       ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (fc->
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (fc->
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (fc->
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_80.constr_.
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
  ._24_1_ = (fc->
            super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
            ).field_0x18;
  local_80.prepro_.lb_ = -INFINITY;
  local_80.prepro_.ub_ = INFINITY;
  local_80.prepro_.type_ = CONTINUOUS;
  local_80.prepro_.result_var_ = -1;
  local_80.converter_ =
       (FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        *)this;
  VVar3 = BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>
          ::Convert(&local_80);
  if (local_80.constr_.
      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
      .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_80.constr_.
                    super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
                    .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.constr_.
                          super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
                          .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.constr_.
                          super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
                          .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.constr_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      paVar2) {
    operator_delete(local_80.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.
                    _M_dataplus._M_p,
                    local_80.constr_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                    _M_allocated_capacity + 1);
  }
  VVar3._4_4_ = 0;
  return VVar3;
}

Assistant:

void RedefineVariable(int res_var, FuncConstraint&& fc) {
    assert( MPD( HasInitExpression(res_var) ) );
		auto ci_old = MPD( GetInitExpression(res_var) );
    fc.SetResultVar(res_var);
		// If this expression exists, use it.
		// TODO make sure any new context is re-converted
		// if necessary.
		auto i = MPD( MapFind(fc) );
    // TODO preprocess, try map again, and use the result.
		if (i<0)
      i = int( MPD( AddConstraint(std::move(fc)) ) );
		auto& ck = GET_CONSTRAINT_KEEPER( FuncConstraint );
    ConInfo ci{&ck, i};
    ReplaceInitExpression(res_var, ci);
    MarkAsBridged(ci_old);
  }